

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGeneration.cpp
# Opt level: O0

Scalar * __thiscall
PatternGeneration::getRandomColor(Scalar *__return_storage_ptr__,PatternGeneration *this)

{
  result_type_conflict1 rVar1;
  result_type rVar2;
  result_type rVar3;
  result_type rVar4;
  element_type *peVar5;
  undefined1 local_2728 [8];
  mt19937 mt;
  random_device rd;
  PatternGeneration *this_local;
  
  std::random_device::random_device((random_device *)&mt._M_p);
  rVar1 = std::random_device::operator()((random_device *)&mt._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2728,(ulong)rVar1);
  peVar5 = std::
           __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  rVar2 = std::uniform_int_distribution<int>::operator()
                    (peVar5,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
  peVar5 = std::
           __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  rVar3 = std::uniform_int_distribution<int>::operator()
                    (peVar5,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
  peVar5 = std::
           __shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)this);
  rVar4 = std::uniform_int_distribution<int>::operator()
                    (peVar5,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                             *)local_2728);
  cv::Scalar_<double>::Scalar_
            (__return_storage_ptr__,(double)(rVar2 % 0xff),(double)(rVar3 % 0xff),
             (double)(rVar4 % 0xff),0.0);
  std::random_device::~random_device((random_device *)&mt._M_p);
  return __return_storage_ptr__;
}

Assistant:

cv::Scalar PatternGeneration::getRandomColor()
{
    std::random_device rd;
    std::mt19937 mt(rd());

    return cv::Scalar( (*dist)(mt)%255, (*dist)(mt)%255, (*dist)(mt)%255);
}